

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::IdentityConstraint> *objToStore,XSerializeEngine *serEng)

{
  XMLSize_t t;
  bool bVar1;
  IdentityConstraint *ic;
  XMLSize_t getAt;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (objToStore->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fCurCount;
    XSerializeEngine::writeSize(serEng,t);
    if (t != 0) {
      getAt = 0;
      do {
        ic = BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::elementAt
                       (&objToStore->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>,getAt);
        IdentityConstraint::storeIC(serEng,ic);
        getAt = getAt + 1;
      } while (t != getAt);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<IdentityConstraint>* const objToStore
                                    , XSerializeEngine&                       serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            IdentityConstraint* data = objToStore->elementAt(i);
            IdentityConstraint::storeIC(serEng, data);
        }
    }

}